

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

toml_type_t __thiscall
loltoml::v_0_1_1::detail::parser_t<comments_skipper_t>::parse_value
          (parser_t<comments_skipper_t> *this)

{
  byte bVar1;
  toml_type_t tVar2;
  
  bVar1 = input_stream_t::peek(&this->input);
  if (bVar1 < 0x66) {
    if (bVar1 == 0x22) {
      parse_string(this);
    }
    else {
      if (bVar1 != 0x27) {
        if (bVar1 == 0x5b) {
          parse_array(this);
          return array;
        }
LAB_0015fcdf:
        tVar2 = parse_date_or_number(this);
        return tVar2;
      }
      parse_literal_string(this);
    }
    tVar2 = string;
  }
  else {
    if (bVar1 == 0x66) {
      parse_false(this);
    }
    else {
      if (bVar1 != 0x74) {
        if (bVar1 == 0x7b) {
          parse_inline_table(this);
          return table;
        }
        goto LAB_0015fcdf;
      }
      parse_true(this);
    }
    tVar2 = boolean;
  }
  return tVar2;
}

Assistant:

toml_type_t parse_value() {
        switch (input.peek()) {
            case '{': {
                parse_inline_table();
                return toml_type_t::table;
            } break;
            case '[': {
                parse_array();
                return toml_type_t::array;
            } break;
            case '"': {
                parse_string();
                return toml_type_t::string;
            } break;
            case '\'': {
                parse_literal_string();
                return toml_type_t::string;
            } break;
            case 't': {
                parse_true();
                return toml_type_t::boolean;
            } break;
            case 'f': {
                parse_false();
                return toml_type_t::boolean;
            } break;
            default: {
                return parse_date_or_number();
            }
        }
    }